

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

bool __thiscall ON_PolylineCurve::SetDomain(ON_PolylineCurve *this,double t0,double t1)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  ON_Interval old_domain;
  ON_Interval new_domain;
  ON_Interval local_50;
  ON_Interval local_40;
  
  iVar2 = (this->m_t).m_count;
  if (1 < iVar2) {
    uVar1 = iVar2 - 1;
    pdVar3 = (this->m_t).m_a;
    dVar7 = *pdVar3;
    if ((dVar7 == t0) && (!NAN(dVar7) && !NAN(t0))) {
      dVar7 = pdVar3[(int)uVar1];
      bVar4 = true;
      if ((dVar7 == t1) && (!NAN(dVar7) && !NAN(t1))) goto LAB_0059a0e7;
    }
    if (t0 < t1) {
      dVar7 = t1;
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
      local_50.m_t[1] = dVar7;
      ON_Interval::ON_Interval(&local_40,t0,t1);
      pdVar3 = (this->m_t).m_a;
      *pdVar3 = t0;
      pdVar3[(int)uVar1] = t1;
      if (iVar2 != 2) {
        uVar5 = 2;
        if (2 < (int)uVar1) {
          uVar5 = (ulong)uVar1;
        }
        uVar6 = 1;
        do {
          dVar7 = ON_Interval::NormalizedParameterAt(&local_50,(this->m_t).m_a[uVar6]);
          dVar7 = ON_Interval::ParameterAt(&local_40,dVar7);
          (this->m_t).m_a[uVar6] = dVar7;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      bVar4 = true;
      goto LAB_0059a0e7;
    }
  }
  bVar4 = false;
LAB_0059a0e7:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return bVar4;
}

Assistant:

bool ON_PolylineCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  const int count = m_t.Count()-1;
  if ( count >= 1 )
  {
    if ( t0 == m_t[0] && t1 == m_t[count] )
      rc = true;
    else if ( t0 < t1 ) 
    {
      const ON_Interval old_domain = Domain();
      const ON_Interval new_domain(t0,t1);
      m_t[0] = t0;
      m_t[count] = t1;
      for ( int i = 1; i < count; i++ )
      {
        m_t[i] = new_domain.ParameterAt( old_domain.NormalizedParameterAt(m_t[i]) );
      }      
			rc=true;
    }
  }
	DestroyCurveTree();
  return rc;  
}